

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O3

size_t read_ints_single(uint8_t *in,uint32_t *out,int length)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (0 < length) {
    uVar3 = (ulong)(uint)length;
    sVar2 = 0;
    do {
      uVar1 = read_int(in + sVar2,out);
      sVar2 = uVar1 + sVar2;
      out = out + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    return sVar2;
  }
  return 0;
}

Assistant:

size_t read_ints_single(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  for (int count = 0; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}